

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_int32 *
drwav_open_and_read_s32
          (drwav_read_proc onRead,drwav_seek_proc onSeek,void *pUserData,uint *channels,
          uint *sampleRate,drwav_uint64 *totalSampleCount)

{
  drwav_bool32 dVar1;
  drwav_int32 *pdVar2;
  drwav wav;
  drwav dStack_168;
  
  if (sampleRate != (uint *)0x0) {
    *sampleRate = 0;
  }
  if (channels != (uint *)0x0) {
    *channels = 0;
  }
  if (totalSampleCount != (drwav_uint64 *)0x0) {
    *totalSampleCount = 0;
  }
  dVar1 = drwav_init(&dStack_168,onRead,onSeek,pUserData);
  if (dVar1 == 0) {
    pdVar2 = (drwav_int32 *)0x0;
  }
  else {
    pdVar2 = drwav__read_and_close_s32(&dStack_168,channels,sampleRate,totalSampleCount);
  }
  return pdVar2;
}

Assistant:

drwav_int32* drwav_open_and_read_s32(drwav_read_proc onRead, drwav_seek_proc onSeek, void* pUserData,
                                     unsigned int* channels, unsigned int* sampleRate, drwav_uint64* totalSampleCount) {
    if (sampleRate) *sampleRate = 0;
    if (channels) *channels = 0;
    if (totalSampleCount) *totalSampleCount = 0;

    drwav wav;
    if (!drwav_init(&wav, onRead, onSeek, pUserData)) {
        return NULL;
    }

    return drwav__read_and_close_s32(&wav, channels, sampleRate, totalSampleCount);
}